

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddExport.c
# Opt level: O0

int Cudd_DumpDDcal(DdManager *dd,int n,DdNode **f,char **inames,char **onames,FILE *fp)

{
  int iVar1;
  int iVar2;
  st__generator *gen_00;
  char *pcVar3;
  ulong local_90;
  ptruint mask;
  ptruint diff;
  ptruint refAddr;
  st__generator *gen;
  int i;
  int retval;
  st__table *visited;
  void *pvStack_58;
  int nvars;
  int *sorted;
  DdNode *scan;
  DdNode *support;
  FILE *fp_local;
  char **onames_local;
  char **inames_local;
  DdNode **f_local;
  DdManager *pDStack_18;
  int n_local;
  DdManager *dd_local;
  
  scan = (DdNode *)0x0;
  pvStack_58 = (void *)0x0;
  iVar2 = dd->size;
  support = (DdNode *)fp;
  fp_local = (FILE *)onames;
  onames_local = inames;
  inames_local = (char **)f;
  f_local._4_4_ = n;
  pDStack_18 = dd;
  _i = st__init_table(st__ptrcmp,st__ptrhash);
  if (_i != (st__table *)0x0) {
    for (gen._0_4_ = 0; (int)(uint)gen < f_local._4_4_; gen._0_4_ = (uint)gen + 1) {
      iVar1 = cuddCollectNodes((DdNode *)((ulong)inames_local[(int)(uint)gen] & 0xfffffffffffffffe),
                               _i);
      if (iVar1 == 0) goto LAB_00a7ac07;
    }
    pcVar3 = *inames_local;
    mask = 0;
    gen_00 = st__init_gen(_i);
    while (iVar1 = st__gen(gen_00,(char **)&sorted,(char **)0x0), iVar1 != 0) {
      mask = (ulong)pcVar3 & 0xfffffffffffffffe ^ (ulong)sorted | mask;
    }
    st__free_gen(gen_00);
    gen._0_4_ = 0;
    while (((uint)gen < 0x40 &&
           (local_90 = (ulong)((1 << ((byte)(uint)gen & 0x1f)) + -1), local_90 < mask))) {
      gen._0_4_ = (uint)gen + 4;
    }
    st__free_table(_i);
    _i = (st__table *)0x0;
    pvStack_58 = malloc((long)iVar2 << 2);
    if (pvStack_58 == (void *)0x0) {
      pDStack_18->errorCode = CUDD_MEMORY_OUT;
    }
    else {
      for (gen._0_4_ = 0; (int)(uint)gen < iVar2; gen._0_4_ = (uint)gen + 1) {
        *(undefined4 *)((long)pvStack_58 + (long)(int)(uint)gen * 4) = 0;
      }
      scan = Cudd_VectorSupport(pDStack_18,(DdNode **)inames_local,f_local._4_4_);
      if (scan == (DdNode *)0x0) {
        scan = (DdNode *)0x0;
      }
      else {
        *(int *)(((ulong)scan & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)scan & 0xfffffffffffffffe) + 4) + 1;
        for (sorted = (int *)scan; *sorted != 0x7fffffff; sorted = *(int **)(sorted + 4)) {
          *(undefined4 *)((long)pvStack_58 + (ulong)(uint)*sorted * 4) = 1;
        }
        Cudd_RecursiveDeref(pDStack_18,scan);
        scan = (DdNode *)0x0;
        for (gen._0_4_ = 0; (int)(uint)gen < iVar2; gen._0_4_ = (uint)gen + 1) {
          if (*(int *)((long)pvStack_58 + (long)pDStack_18->invperm[(int)(uint)gen] * 4) != 0) {
            if ((onames_local == (char **)0x0) ||
               (onames_local[pDStack_18->invperm[(int)(uint)gen]] == (char *)0x0)) {
              gen._4_4_ = fprintf((FILE *)support,"v%d",
                                  (ulong)(uint)pDStack_18->invperm[(int)(uint)gen]);
            }
            else {
              gen._4_4_ = fprintf((FILE *)support,"%s",
                                  onames_local[pDStack_18->invperm[(int)(uint)gen]]);
            }
            if (gen._4_4_ == -1) goto LAB_00a7ac07;
          }
          pcVar3 = " * ";
          if ((uint)gen == iVar2 + -1) {
            pcVar3 = "\n";
          }
          iVar1 = fprintf((FILE *)support,"%s",pcVar3);
          if (iVar1 == -1) goto LAB_00a7ac07;
        }
        if (pvStack_58 != (void *)0x0) {
          free(pvStack_58);
        }
        pvStack_58 = (void *)0x0;
        _i = st__init_table(st__ptrcmp,st__ptrhash);
        if (_i != (st__table *)0x0) {
          for (gen._0_4_ = 0; (int)(uint)gen < f_local._4_4_; gen._0_4_ = (uint)gen + 1) {
            iVar2 = ddDoDumpDDcal(pDStack_18,
                                  (DdNode *)
                                  ((ulong)inames_local[(int)(uint)gen] & 0xfffffffffffffffe),
                                  (FILE *)support,_i,onames_local,local_90);
            if (iVar2 == 0) goto LAB_00a7ac07;
            if (fp_local == (FILE *)0x0) {
              gen._4_4_ = fprintf((FILE *)support,"f%d = ",(ulong)(uint)gen);
            }
            else {
              gen._4_4_ = fprintf((FILE *)support,"%s = ",
                                  *(undefined8 *)(&fp_local->_flags + (long)(int)(uint)gen * 2));
            }
            if (gen._4_4_ == -1) goto LAB_00a7ac07;
            pcVar3 = "";
            if (((ulong)inames_local[(int)(uint)gen] & 1) != 0) {
              pcVar3 = "\'";
            }
            iVar2 = fprintf((FILE *)support,"n%p%s\n",
                            ((ulong)inames_local[(int)(uint)gen] & local_90) / 0x28,pcVar3);
            if (iVar2 == -1) goto LAB_00a7ac07;
          }
          iVar2 = fprintf((FILE *)support,"[");
          if (iVar2 != -1) {
            for (gen._0_4_ = 0; (int)(uint)gen < f_local._4_4_; gen._0_4_ = (uint)gen + 1) {
              if (fp_local == (FILE *)0x0) {
                fprintf((FILE *)support,"f%d",(ulong)(uint)gen);
              }
              else {
                fprintf((FILE *)support,"%s",
                        *(undefined8 *)(&fp_local->_flags + (long)(int)(uint)gen * 2));
              }
              pcVar3 = " ";
              if ((uint)gen == f_local._4_4_ - 1U) {
                pcVar3 = "";
              }
              iVar2 = fprintf((FILE *)support,"%s",pcVar3);
              if (iVar2 == -1) goto LAB_00a7ac07;
            }
            iVar2 = fprintf((FILE *)support,"]\n");
            if (iVar2 != -1) {
              if (_i != (st__table *)0x0) {
                st__free_table(_i);
              }
              return 1;
            }
          }
        }
      }
    }
  }
LAB_00a7ac07:
  if ((pvStack_58 != (void *)0x0) && (pvStack_58 != (void *)0x0)) {
    free(pvStack_58);
  }
  if (scan != (DdNode *)0x0) {
    Cudd_RecursiveDeref(pDStack_18,scan);
  }
  if (_i != (st__table *)0x0) {
    st__free_table(_i);
  }
  return 0;
}

Assistant:

int
Cudd_DumpDDcal(
  DdManager * dd /* manager */,
  int  n /* number of output nodes to be dumped */,
  DdNode ** f /* array of output nodes to be dumped */,
  char ** inames /* array of input names (or NULL) */,
  char ** onames /* array of output names (or NULL) */,
  FILE * fp /* pointer to the dump file */)
{
    DdNode        *support = NULL;
    DdNode        *scan;
    int           *sorted = NULL;
    int           nvars = dd->size;
    st__table      *visited = NULL;
    int           retval;
    int           i;
    st__generator  *gen;
    ptruint       refAddr, diff, mask;

    /* Initialize symbol table for visited nodes. */
    visited = st__init_table( st__ptrcmp, st__ptrhash);
    if (visited == NULL) goto failure;

    /* Collect all the nodes of this DD in the symbol table. */
    for (i = 0; i < n; i++) {
        retval = cuddCollectNodes(Cudd_Regular(f[i]),visited);
        if (retval == 0) goto failure;
    }

    /* Find how many most significant hex digits are identical
    ** in the addresses of all the nodes. Build a mask based
    ** on this knowledge, so that digits that carry no information
    ** will not be printed. This is done in two steps.
    **  1. We scan the symbol table to find the bits that differ
    **     in at least 2 addresses.
    **  2. We choose one of the possible masks. There are 8 possible
    **     masks for 32-bit integer, and 16 possible masks for 64-bit
    **     integers.
    */

    /* Find the bits that are different. */
    refAddr = (ptruint) Cudd_Regular(f[0]);
    diff = 0;
    gen = st__init_gen(visited);
    while ( st__gen(gen, (const char **)&scan, NULL)) {
        diff |= refAddr ^ (ptruint) scan;
    }
    st__free_gen(gen);

    /* Choose the mask. */
    for (i = 0; (unsigned) i < 8 * sizeof(ptruint); i += 4) {
        mask = (1 << i) - 1;
        if (diff <= mask) break;
    }
    st__free_table(visited);
    visited = NULL;

    /* Build a bit array with the support of f. */
    sorted = ABC_ALLOC(int,nvars);
    if (sorted == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        goto failure;
    }
    for (i = 0; i < nvars; i++) sorted[i] = 0;

    /* Take the union of the supports of each output function. */
    support = Cudd_VectorSupport(dd,f,n);
    if (support == NULL) goto failure;
    cuddRef(support);
    scan = support;
    while (!cuddIsConstant(scan)) {
        sorted[scan->index] = 1;
        scan = cuddT(scan);
    }
    Cudd_RecursiveDeref(dd,support);
    support = NULL; /* so that we do not try to free it in case of failure */
    for (i = 0; i < nvars; i++) {
        if (sorted[dd->invperm[i]]) {
            if (inames == NULL || inames[dd->invperm[i]] == NULL) {
                retval = fprintf(fp,"v%d", dd->invperm[i]);
            } else {
                retval = fprintf(fp,"%s", inames[dd->invperm[i]]);
            }
            if (retval == EOF) goto failure;
        }
        retval = fprintf(fp,"%s", i == nvars - 1 ? "\n" : " * ");
        if (retval == EOF) goto failure;
    }
    ABC_FREE(sorted);
    sorted = NULL;

    /* Initialize symbol table for visited nodes. */
    visited = st__init_table( st__ptrcmp, st__ptrhash);
    if (visited == NULL) goto failure;

    /* Call the function that really gets the job done. */
    for (i = 0; i < n; i++) {
        retval = ddDoDumpDDcal(dd,Cudd_Regular(f[i]),fp,visited,inames,mask);
        if (retval == 0) goto failure;
        if (onames == NULL) {
            retval = fprintf(fp, "f%d = ", i);
        } else {
            retval = fprintf(fp, "%s = ", onames[i]);
        }
        if (retval == EOF) goto failure;
        retval = fprintf(fp, "n%p%s\n",
                         (void *) (((ptruint) f[i] & mask) /
                         (ptruint) sizeof(DdNode)),
                         Cudd_IsComplement(f[i]) ? "'" : "");
        if (retval == EOF) goto failure;
    }

    /* Write trailer and return. */
    retval = fprintf(fp, "[");
    if (retval == EOF) goto failure;
    for (i = 0; i < n; i++) {
        if (onames == NULL) {
            retval = fprintf(fp, "f%d", i);
        } else {
            retval = fprintf(fp, "%s", onames[i]);
        }
        retval = fprintf(fp, "%s", i == n-1 ? "" : " ");
        if (retval == EOF) goto failure;
    }
    retval = fprintf(fp, "]\n");
    if (retval == EOF) goto failure;

    if ( visited )
        st__free_table(visited);
    return(1);

failure:
    if (sorted != NULL) ABC_FREE(sorted);
    if (support != NULL) Cudd_RecursiveDeref(dd,support);
    if (visited != NULL) st__free_table(visited);
    return(0);

}